

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O3

void __thiscall Menu::display(Menu *this)

{
  pointer ppVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  line(0x23,'-');
  lVar4 = std::cout;
  *(uint *)(getppid + *(long *)(std::cout + -0x18)) =
       *(uint *)(getppid + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::__cxx11::string::operator= + *(long *)(lVar4 + -0x18)) = 0x23;
  lVar4 = *(long *)(lVar4 + -0x18);
  if (*(char *)((long)&std::cin + lVar4 + 1) == '\0') {
    std::ios::widen((char)lVar4 + -0x30);
    *(undefined1 *)((long)&std::cin + lVar4 + 1) = 1;
  }
  *(undefined1 *)((long)&std::cin + lVar4) = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  line(0x23,'-');
  if (0x40 < (ulong)((long)(this->options).
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->options).
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar5 = 1;
    lVar4 = 0x48;
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,". ",2);
      ppVar1 = (this->options).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->options).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6;
      if (uVar3 <= uVar5) goto LAB_0011502e;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,*(char **)((long)ppVar1 + lVar4 + -8),
                          *(long *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar4));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < (ulong)((long)(this->options).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->options).
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0. ",3);
  ppVar1 = (this->options).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->options).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(ppVar1->first)._M_dataplus._M_p,(ppVar1->first)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  uVar5 = 0;
  uVar3 = 0;
LAB_0011502e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar3
            );
}

Assistant:

void Menu::display() {
    line(35);
    cout << left << setw(35) << setfill(' ') << name << endl;
    line(35);
    for (int i = 1; i < options.size(); i++) {
        cout << i << ". " << options.at(i).first << endl;
    }
    // Por convenção, a opção 0 é sempre fechar/voltar
    cout << endl << "0. " << options.at(0).first << endl;
}